

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.hpp
# Opt level: O2

void readOption(char *option,int argc,char **argv,bool *out)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = 0;
  uVar4 = (ulong)(uint)argc;
  if (argc < 1) {
    uVar4 = uVar3;
  }
  do {
    if (uVar4 == uVar3) {
      bVar1 = false;
      goto LAB_00116d23;
    }
    iVar2 = strcmp(argv[uVar3],option);
    uVar3 = uVar3 + 1;
  } while (iVar2 != 0);
  bVar1 = true;
LAB_00116d23:
  *out = bVar1;
  return;
}

Assistant:

inline void readOption(const char* option, int argc, char** argv, bool& out) {
	for (int i = 0; i < argc; ++i) {
		if (strcmp(argv[i], option) == 0) {
			out = true;
			return;
		}
	}
	out = false;
}